

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,uint *arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_1)

{
  Nonnull<char_*> pcVar1;
  size_t in_R9;
  string_view data;
  string_view format_00;
  string result;
  char *local_98;
  size_t local_90;
  char local_88;
  undefined7 uStack_87;
  long local_78;
  Nonnull<char_*> local_70;
  size_type local_68;
  pointer local_60;
  long local_58;
  Nonnull<char_*> local_50;
  char local_48 [32];
  
  format_00._M_len = format._M_str;
  pcVar1 = absl::lts_20250127::numbers_internal::FastIntToBuffer(*arg,local_48);
  local_78 = (long)pcVar1 - (long)local_48;
  local_60 = (arg_1->_M_dataplus)._M_p;
  local_68 = arg_1->_M_string_length;
  local_90 = 0;
  local_88 = '\0';
  format_00._M_str = (char *)&local_78;
  local_98 = &local_88;
  local_70 = local_48;
  local_58 = local_78;
  local_50 = local_48;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_98,(Nonnull<std::string_*>)format._M_len,format_00,
             (Nullable<const_absl::string_view_*>)0x2,in_R9);
  data._M_str = local_98;
  data._M_len = local_90;
  Write(this,data);
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }